

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

borg_magic * borg_get_spell_entry(int book,int entry)

{
  int local_20;
  int local_1c;
  int spell_num;
  int entry_in_book;
  int entry_local;
  int book_local;
  
  local_1c = 0;
  local_20 = 0;
  do {
    if ((player->class->magic).total_spells <= local_20) {
      return (borg_magic *)0x0;
    }
    if (borg_magics[local_20].book == book) {
      if (local_1c == entry) {
        return borg_magics + local_20;
      }
      local_1c = local_1c + 1;
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

borg_magic *borg_get_spell_entry(int book, int entry)
{
    int entry_in_book = 0;

    for (int spell_num = 0; spell_num < player->class->magic.total_spells;
         spell_num++) {
        if (borg_magics[spell_num].book == book) {
            if (entry_in_book == entry)
                return &borg_magics[spell_num];
            entry_in_book++;
        }
    }
    return NULL;
}